

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.h
# Opt level: O0

int secp256k1_musig_pubnonce_serialize
              (secp256k1_context *ctx,uchar *out66,secp256k1_musig_pubnonce *nonce)

{
  int iVar1;
  long in_RDX;
  void *in_RSI;
  size_t size;
  int ret;
  int i;
  secp256k1_ge ges [2];
  secp256k1_musig_pubnonce *in_stack_ffffffffffffff18;
  int in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  secp256k1_context *in_stack_ffffffffffffff28;
  undefined4 local_4;
  
  if (in_RSI == (void *)0x0) {
    secp256k1_callback_call
              ((secp256k1_callback *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
               (char *)in_stack_ffffffffffffff18);
    local_4 = 0;
  }
  else {
    memset(in_RSI,0,0x42);
    if (in_RDX == 0) {
      secp256k1_callback_call
                ((secp256k1_callback *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20)
                 ,(char *)in_stack_ffffffffffffff18);
      local_4 = 0;
    }
    else {
      iVar1 = secp256k1_musig_pubnonce_load
                        (in_stack_ffffffffffffff28,
                         (secp256k1_ge *)
                         CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                         in_stack_ffffffffffffff18);
      if (iVar1 == 0) {
        local_4 = 0;
      }
      else {
        for (iVar1 = 0; iVar1 < 2; iVar1 = iVar1 + 1) {
          in_stack_ffffffffffffff20 =
               secp256k1_eckey_pubkey_serialize
                         ((secp256k1_ge *)in_stack_ffffffffffffff28,
                          (uchar *)CONCAT44(iVar1,in_stack_ffffffffffffff20),(size_t *)0x21,0);
        }
        local_4 = 1;
      }
    }
  }
  return local_4;
}

Assistant:

int secp256k1_musig_pubnonce_serialize(const secp256k1_context* ctx, unsigned char *out66, const secp256k1_musig_pubnonce* nonce) {
    secp256k1_ge ges[2];
    int i;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(out66 != NULL);
    memset(out66, 0, 66);
    ARG_CHECK(nonce != NULL);

    if (!secp256k1_musig_pubnonce_load(ctx, ges, nonce)) {
        return 0;
    }
    for (i = 0; i < 2; i++) {
        int ret;
        size_t size = 33;
        ret = secp256k1_eckey_pubkey_serialize(&ges[i], &out66[33*i], &size, 1);
#ifdef VERIFY
        /* serialize must succeed because the point was just loaded */
        VERIFY_CHECK(ret && size == 33);
#else
        (void) ret;
#endif
    }
    return 1;
}